

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV8S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  char *pcVar2;
  ushort *puVar3;
  uint *puVar4;
  ulong hasbits_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (ptr[2] < '\0') {
    pcVar2 = SingularVarBigint<bool,unsigned_short,false>(msg,ptr + 2,ctx,data,table,hasbits_00);
    return pcVar2;
  }
  puVar3 = (ushort *)(ptr + 3);
  *(bool *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30)) = ptr[2] != '\0';
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar3) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar4 & 3) != 0) {
        AlignFail();
      }
      *puVar4 = *puVar4 | (uint)hasbits_00;
    }
    return (char *)puVar3;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar3;
  if ((uVar1 & 7) == 0) {
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
    return pcVar2;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}